

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::LocaleDisplayNamesImpl::localeDisplayName
          (LocaleDisplayNamesImpl *this,Locale *loc,UnicodeString *result)

{
  UnicodeString *pUVar1;
  char cVar2;
  char cVar3;
  ushort uVar4;
  char *pcVar5;
  Locale *this_00;
  UBool UVar6;
  ushort uVar7;
  int iVar8;
  undefined4 extraout_var;
  UnicodeString *this_01;
  undefined7 uVar10;
  byte bVar11;
  char cVar12;
  UErrorCode status;
  StringEnumeration *local_268;
  UnicodeString *local_260;
  UnicodeString *local_258;
  ICUDataTable *local_250;
  UnicodeString *local_248;
  LocaleDisplayNamesImpl *local_240;
  SimpleFormatter *local_238;
  UnicodeString *local_230;
  UObject local_228;
  Locale *local_220;
  UnicodeString temp;
  UnicodeString resultRemainder;
  UnicodeString resultName;
  UnicodeString temp3;
  UnicodeString temp2;
  char buffer [157];
  char *pcVar9;
  
  if (loc->fIsBogus != '\0') {
    UnicodeString::setToBogus(result);
    return result;
  }
  local_228._vptr_UObject = (_func_int **)&PTR__UnicodeString_003daac8;
  resultName.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003daac8;
  resultName.fUnion.fStackFields.fLengthAndFlags = 2;
  pcVar9 = "root";
  if (loc->language[0] != '\0') {
    pcVar9 = loc->language;
  }
  local_258 = (UnicodeString *)loc->script;
  local_260 = (UnicodeString *)loc->country;
  pcVar5 = loc->baseName;
  local_238 = (SimpleFormatter *)(long)loc->variantBegin;
  cVar2 = loc->script[0];
  cVar3 = loc->country[0];
  uVar10 = (undefined7)((ulong)result >> 8);
  local_268 = (StringEnumeration *)CONCAT44(local_268._4_4_,(int)CONCAT71(uVar10,cVar2 != '\0'));
  local_250 = (ICUDataTable *)CONCAT44(local_250._4_4_,(int)CONCAT71(uVar10,cVar3 != '\0'));
  local_248 = (UnicodeString *)CONCAT71(local_248._1_7_,pcVar5[(long)local_238]);
  local_230 = result;
  local_220 = loc;
  cVar12 = cVar2 != '\0';
  bVar11 = cVar3 != '\0';
  if (this->dialectHandling != ULDN_DIALECT_NAMES) goto LAB_0027f8d2;
  local_240 = this;
  if (cVar2 == '\0' || cVar3 == '\0') {
    if (cVar2 != '\0') goto LAB_0027f7f6;
    if (cVar3 == '\0') goto LAB_0027f8c3;
  }
  else {
    ncat(buffer,(uint32_t)loc,pcVar9,"_",local_258,"_",local_260,0);
    loc = (Locale *)buffer;
    localeIdName(this,(char *)loc,&resultName);
    if ((resultName.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
LAB_0027f8c3:
      this = local_240;
      cVar12 = '\0';
      bVar11 = 0;
      goto LAB_0027f8d2;
    }
LAB_0027f7f6:
    ncat(buffer,(uint32_t)loc,pcVar9,"_",local_258,0);
    localeIdName(local_240,buffer,&resultName);
    loc = (Locale *)((ulong)local_268 & 0xffffffff);
    cVar12 = '\0';
    if ((resultName.fUnion.fStackFields.fLengthAndFlags & 1U) != 0) {
      cVar12 = (char)local_268;
    }
    if (((byte)resultName.fUnion.fStackFields.fLengthAndFlags & 1 & cVar3 != '\0') == 0) {
      this = local_240;
      bVar11 = (byte)local_250;
      goto LAB_0027f8d2;
    }
  }
  ncat(buffer,(uint32_t)loc,pcVar9,"_",local_260,0);
  localeIdName(local_240,buffer,&resultName);
  bVar11 = (byte)local_250;
  if ((resultName.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
    bVar11 = (byte)resultName.fUnion.fStackFields.fLengthAndFlags & 1;
  }
  this = local_240;
  cVar12 = (char)local_268;
LAB_0027f8d2:
  this_00 = local_220;
  if ((ushort)resultName.fUnion.fStackFields.fLengthAndFlags < 0x20 ||
      (resultName.fUnion.fStackFields.fLengthAndFlags & 1U) != 0) {
    localeIdName(this,pcVar9,&resultName);
  }
  resultRemainder.super_Replaceable.super_UObject._vptr_UObject =
       (UObject)(UObject)local_228._vptr_UObject;
  resultRemainder.fUnion.fStackFields.fLengthAndFlags = 2;
  temp.super_Replaceable.super_UObject._vptr_UObject = (UObject)(UObject)local_228._vptr_UObject;
  temp.fUnion.fStackFields.fLengthAndFlags = 2;
  status = U_ZERO_ERROR;
  if (cVar12 != '\0') {
    scriptDisplayName(this,(char *)local_258,&temp,'\x01');
    UnicodeString::append(&resultRemainder,&temp);
  }
  if (bVar11 != 0) {
    regionDisplayName(this,(char *)local_260,&temp,'\x01');
    appendWithSep(this,&resultRemainder,&temp);
  }
  if ((char)local_248 != '\0') {
    ICUDataTable::get(&this->langData,"Variants",pcVar5 + (long)local_238,&temp);
    appendWithSep(this,&resultRemainder,&temp);
  }
  local_258 = &this->formatOpenParen;
  local_260 = &this->formatReplaceOpenParen;
  UnicodeString::findAndReplace(&resultRemainder,local_258,local_260);
  local_248 = &this->formatCloseParen;
  pUVar1 = &this->formatReplaceCloseParen;
  UnicodeString::findAndReplace(&resultRemainder,local_248,pUVar1);
  local_268 = Locale::createKeywords(this_00,&status);
  if ((local_268 != (StringEnumeration *)0x0) && (status < U_ILLEGAL_ARGUMENT_ERROR)) {
    temp2.super_Replaceable.super_UObject._vptr_UObject = (UObject)(UObject)local_228._vptr_UObject;
    temp2.fUnion.fStackFields.fLengthAndFlags = 2;
    local_250 = &this->langData;
    local_238 = &this->keyTypeFormat;
    while( true ) {
      iVar8 = (*(local_268->super_UObject)._vptr_UObject[5])(local_268,0,&status);
      pcVar9 = (char *)CONCAT44(extraout_var,iVar8);
      if (pcVar9 == (char *)0x0) break;
      buffer[0] = '\0';
      Locale::getKeywordValue(local_220,pcVar9,buffer,100,&status);
      if ((U_ZERO_ERROR < status) || (status == U_STRING_NOT_TERMINATED_WARNING)) {
        UnicodeString::~UnicodeString(&temp2);
        goto LAB_0027fcc4;
      }
      ICUDataTable::get(local_250,"Keys",pcVar9,&temp);
      UnicodeString::findAndReplace(&temp,local_258,local_260);
      UnicodeString::findAndReplace(&temp,local_248,pUVar1);
      keyValueDisplayName(this,pcVar9,buffer,&temp2,'\x01');
      UnicodeString::findAndReplace(&temp2,local_258,local_260);
      UnicodeString::findAndReplace(&temp2,local_248,pUVar1);
      UnicodeString::UnicodeString(&temp3,buffer,-1,kInvariant);
      UVar6 = UnicodeString::operator!=(&temp2,&temp3);
      UnicodeString::~UnicodeString(&temp3);
      if (UVar6 == '\0') {
        UnicodeString::UnicodeString(&temp3,pcVar9,-1,kInvariant);
        UVar6 = UnicodeString::operator!=(&temp,&temp3);
        UnicodeString::~UnicodeString(&temp3);
        if (UVar6 == '\0') {
          appendWithSep(this,&resultRemainder,&temp);
          this_01 = UnicodeString::append(&resultRemainder,L'=');
          UnicodeString::append(this_01,&temp2);
        }
        else {
          temp3.super_Replaceable.super_UObject._vptr_UObject =
               (UObject)(UObject)local_228._vptr_UObject;
          temp3.fUnion.fStackFields.fLengthAndFlags = 2;
          SimpleFormatter::format(local_238,&temp,&temp2,&temp3,&status);
          appendWithSep(this,&resultRemainder,&temp3);
          UnicodeString::~UnicodeString(&temp3);
        }
      }
      else {
        appendWithSep(this,&resultRemainder,&temp2);
      }
    }
    UnicodeString::~UnicodeString(&temp2);
  }
  pUVar1 = local_230;
  if ((ushort)resultRemainder.fUnion.fStackFields.fLengthAndFlags < 0x20) {
    UnicodeString::operator=(local_230,&resultName);
  }
  else {
    uVar4 = (local_230->fUnion).fStackFields.fLengthAndFlags;
    uVar7 = 2;
    if ((uVar4 & 1) == 0) {
      uVar7 = uVar4 & 0x1e;
    }
    (local_230->fUnion).fStackFields.fLengthAndFlags = uVar7;
    SimpleFormatter::format(&this->format,&resultName,&resultRemainder,local_230,&status);
  }
  adjustForUsageAndContext(this,kCapContextUsageLanguage,pUVar1);
  if (local_268 != (StringEnumeration *)0x0) {
LAB_0027fcc4:
    (*(local_268->super_UObject)._vptr_UObject[1])();
  }
  UnicodeString::~UnicodeString(&temp);
  UnicodeString::~UnicodeString(&resultRemainder);
  UnicodeString::~UnicodeString(&resultName);
  return local_230;
}

Assistant:

UnicodeString&
LocaleDisplayNamesImpl::localeDisplayName(const Locale& loc,
                                          UnicodeString& result) const {
  if (loc.isBogus()) {
    result.setToBogus();
    return result;
  }
  UnicodeString resultName;

  const char* lang = loc.getLanguage();
  if (uprv_strlen(lang) == 0) {
    lang = "root";
  }
  const char* script = loc.getScript();
  const char* country = loc.getCountry();
  const char* variant = loc.getVariant();

  UBool hasScript = uprv_strlen(script) > 0;
  UBool hasCountry = uprv_strlen(country) > 0;
  UBool hasVariant = uprv_strlen(variant) > 0;

  if (dialectHandling == ULDN_DIALECT_NAMES) {
    char buffer[ULOC_FULLNAME_CAPACITY];
    do { // loop construct is so we can break early out of search
      if (hasScript && hasCountry) {
        ncat(buffer, ULOC_FULLNAME_CAPACITY, lang, "_", script, "_", country, (char *)0);
        localeIdName(buffer, resultName);
        if (!resultName.isBogus()) {
          hasScript = FALSE;
          hasCountry = FALSE;
          break;
        }
      }
      if (hasScript) {
        ncat(buffer, ULOC_FULLNAME_CAPACITY, lang, "_", script, (char *)0);
        localeIdName(buffer, resultName);
        if (!resultName.isBogus()) {
          hasScript = FALSE;
          break;
        }
      }
      if (hasCountry) {
        ncat(buffer, ULOC_FULLNAME_CAPACITY, lang, "_", country, (char*)0);
        localeIdName(buffer, resultName);
        if (!resultName.isBogus()) {
          hasCountry = FALSE;
          break;
        }
      }
    } while (FALSE);
  }
  if (resultName.isBogus() || resultName.isEmpty()) {
    localeIdName(lang, resultName);
  }

  UnicodeString resultRemainder;
  UnicodeString temp;
  UErrorCode status = U_ZERO_ERROR;

  if (hasScript) {
    resultRemainder.append(scriptDisplayName(script, temp, TRUE));
  }
  if (hasCountry) {
    appendWithSep(resultRemainder, regionDisplayName(country, temp, TRUE));
  }
  if (hasVariant) {
    appendWithSep(resultRemainder, variantDisplayName(variant, temp, TRUE));
  }
  resultRemainder.findAndReplace(formatOpenParen, formatReplaceOpenParen);
  resultRemainder.findAndReplace(formatCloseParen, formatReplaceCloseParen);

  LocalPointer<StringEnumeration> e(loc.createKeywords(status));
  if (e.isValid() && U_SUCCESS(status)) {
    UnicodeString temp2;
    char value[ULOC_KEYWORD_AND_VALUES_CAPACITY]; // sigh, no ULOC_VALUE_CAPACITY
    const char* key;
    while ((key = e->next((int32_t *)0, status)) != NULL) {
      value[0] = 0;
      loc.getKeywordValue(key, value, ULOC_KEYWORD_AND_VALUES_CAPACITY, status);
      if (U_FAILURE(status) || status == U_STRING_NOT_TERMINATED_WARNING) {
        return result;
      }
      keyDisplayName(key, temp, TRUE);
      temp.findAndReplace(formatOpenParen, formatReplaceOpenParen);
      temp.findAndReplace(formatCloseParen, formatReplaceCloseParen);
      keyValueDisplayName(key, value, temp2, TRUE);
      temp2.findAndReplace(formatOpenParen, formatReplaceOpenParen);
      temp2.findAndReplace(formatCloseParen, formatReplaceCloseParen);
      if (temp2 != UnicodeString(value, -1, US_INV)) {
        appendWithSep(resultRemainder, temp2);
      } else if (temp != UnicodeString(key, -1, US_INV)) {
        UnicodeString temp3;
        keyTypeFormat.format(temp, temp2, temp3, status);
        appendWithSep(resultRemainder, temp3);
      } else {
        appendWithSep(resultRemainder, temp)
          .append((UChar)0x3d /* = */)
          .append(temp2);
      }
    }
  }

  if (!resultRemainder.isEmpty()) {
    format.format(resultName, resultRemainder, result.remove(), status);
    return adjustForUsageAndContext(kCapContextUsageLanguage, result);
  }

  result = resultName;
  return adjustForUsageAndContext(kCapContextUsageLanguage, result);
}